

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::~Benchmark(Benchmark *this)

{
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  if (this->cache_ != (Cache *)0x0) {
    (*this->cache_->_vptr_Cache[1])();
  }
  if (this->filter_policy_ != (FilterPolicy *)0x0) {
    (*this->filter_policy_->_vptr_FilterPolicy[1])();
    return;
  }
  return;
}

Assistant:

~Benchmark() {
    delete db_;
    delete cache_;
    delete filter_policy_;
  }